

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O0

void __thiscall
cfd::core::AbstractTransaction::RemoveTxOut(AbstractTransaction *this,uint32_t index)

{
  CfdException *this_00;
  allocator local_51;
  string local_50;
  CfdSourceLocation local_30;
  int local_18;
  uint local_14;
  int ret;
  uint32_t index_local;
  AbstractTransaction *this_local;
  
  local_14 = index;
  _ret = this;
  (*this->_vptr_AbstractTransaction[0xc])(this,(ulong)index,0x237,"RemoveTxOut");
  local_18 = wally_tx_remove_output((wally_tx *)this->wally_tx_pointer_,(ulong)local_14);
  if (local_18 != 0) {
    local_30.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_transaction_common.cpp"
                 ,0x2f);
    local_30.filename = local_30.filename + 1;
    local_30.line = 0x23c;
    local_30.funcname = "RemoveTxOut";
    logger::warn<int&>(&local_30,"wally_tx_remove_output NG[{}].",&local_18);
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_50,"vout remove error.",&local_51);
    CfdException::CfdException(this_00,kCfdIllegalStateError,&local_50);
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  return;
}

Assistant:

void AbstractTransaction::RemoveTxOut(uint32_t index) {
  CheckTxOutIndex(index, __LINE__, __FUNCTION__);

  int ret = wally_tx_remove_output(
      static_cast<struct wally_tx *>(wally_tx_pointer_), index);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_remove_output NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "vout remove error.");
  }
}